

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O0

void class8(int *ip)

{
  int iVar1;
  int mode;
  int *ip_local;
  
  loccnt = loccnt + 2;
  iVar1 = getoperand(ip,2,0x3b);
  if ((iVar1 != 0) && (pass == 1)) {
    if ((value & 0xf8) == 0) {
      putbyte(data_loccnt,opval);
      putbyte(data_loccnt + 1,1 << ((byte)value & 0x1f));
      println();
    }
    else {
      error("Incorrect page index!");
    }
  }
  return;
}

Assistant:

void
class8(int *ip)
{
	int mode;

	/* update location counter */
	loccnt += 2;

	/* get operand */
	mode = getoperand(ip, IMM, ';');
	if (!mode)
		return;

	/* generate code */
	if (pass == LAST_PASS) {
		/* check page index */
		if (value & 0xF8) {
			error("Incorrect page index!");
			return;
		}

		/* opcodes */
		putbyte(data_loccnt, opval);
		putbyte(data_loccnt+1, (1 << value));

		/* output line */
		println();
	}
}